

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionally_enabled_mutex.hpp
# Opt level: O2

void __thiscall
boost::asio::detail::conditionally_enabled_mutex::conditionally_enabled_mutex
          (conditionally_enabled_mutex *this,bool enabled)

{
  posix_mutex::posix_mutex(&this->mutex_);
  this->enabled_ = enabled;
  return;
}

Assistant:

explicit conditionally_enabled_mutex(bool enabled)
    : enabled_(enabled)
  {
  }